

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void set_ext_params_cpy_cam_sr(xc_func_type *p,double *ext_params)

{
  long lVar1;
  int in_EDX;
  
  copy_params(p,(double *)(ulong)((p->info->ext_params).n - 2),in_EDX);
  lVar1 = (long)(p->info->ext_params).n;
  p->cam_beta = p->ext_params[lVar1 + -2];
  p->cam_omega = p->ext_params[lVar1 + -1];
  return;
}

Assistant:

void
set_ext_params_cpy_cam_sr(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 2;
  copy_params(p, ext_params, nparams);
  set_ext_params_cam_sr(p, ext_params);
}